

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

int __thiscall Socket::getSockOpt(Socket *this,int option)

{
  undefined4 in_EAX;
  int iVar1;
  int optval;
  socklen_t optlen;
  
  _optval = CONCAT44(4,in_EAX);
  iVar1 = getsockopt(this->SocketFileDescriptor,1,option,&optval,&optlen);
  if (-1 < iVar1) {
    iVar1 = optval;
  }
  return iVar1;
}

Assistant:

int Socket::getSockOpt(int option) {
  //XTRACE(IPC, DEB, "getSockOpt(%d), fd %d", option, SocketFileDescriptor);
  int optval, ret;
  socklen_t optlen;
  optlen = sizeof(optval);
  if ((ret = getsockopt(SocketFileDescriptor, SOL_SOCKET, option, (void *)&optval, &optlen)) <
      0) {
    //XTRACE(IPC, WAR, "getSockOpt(%d) failed, fd %d, ret %d", option, SocketFileDescriptor, ret);
    return ret;
  }
  return optval;
}